

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_frame.hpp
# Opt level: O2

void __thiscall
DSFrame::DSFrame(DSFrame *this,PVideoFrame *src,VideoInfo vi,IScriptEnvironment *env)

{
  DSFormat *this_00;
  int iVar1;
  uchar **ppuVar2;
  int *piVar3;
  BYTE *pBVar4;
  ulong uVar5;
  int i;
  long lVar6;
  ulong uVar7;
  DSFormat local_4c;
  
  this_00 = &this->Format;
  this->StrideBytes = (int *)0x0;
  this->DstPointers = (uchar **)0x0;
  this->FrameWidth = 0;
  this->FrameHeight = 0;
  this->SrcPointers = (uchar **)0x0;
  DSFormat::DSFormat(this_00);
  this->_vscore = (VSCore *)0x0;
  this->_vsapi = (VSAPI *)0x0;
  this->_vssrc = (VSFrameRef *)0x0;
  this->_vsdst = (VSFrameRef *)0x0;
  this->_vsformat = (VSFormat *)0x0;
  PVideoFrame::PVideoFrame(&this->_avssrc,src);
  (this->_vi).num_audio_samples = vi.num_audio_samples;
  (this->_vi).nchannels = vi.nchannels;
  (this->_vi).image_type = vi.image_type;
  (this->_vi).num_frames = vi.num_frames;
  (this->_vi).pixel_type = vi.pixel_type;
  (this->_vi).audio_samples_per_second = vi.audio_samples_per_second;
  (this->_vi).sample_type = vi.sample_type;
  (this->_vi).width = vi.width;
  (this->_vi).height = vi.height;
  (this->_vi).fps_numerator = vi.fps_numerator;
  (this->_vi).fps_denominator = vi.fps_denominator;
  this->_env = env;
  this->planes_y[0] = 1;
  this->planes_y[1] = 2;
  this->planes_y[2] = 4;
  this->planes_y[3] = 0x10;
  this->planes_r[0] = 0x20;
  this->planes_r[1] = 0x40;
  this->planes_r[2] = 0x80;
  this->planes_r[3] = 0x10;
  this->planes = (int *)0x0;
  if ((this->_avssrc).p != (VideoFrame *)0x0) {
    DSFormat::DSFormat(&local_4c,(this->_vi).pixel_type);
    (this->Format).SSH = local_4c.SSH;
    (this->Format).BitsPerSample = local_4c.BitsPerSample;
    (this->Format).BytesPerSample = local_4c.BytesPerSample;
    (this->Format).Planes = local_4c.Planes;
    this_00->IsFamilyYUV = local_4c.IsFamilyYUV;
    this_00->IsFamilyRGB = local_4c.IsFamilyRGB;
    this_00->IsFamilyYCC = local_4c.IsFamilyYCC;
    this_00->IsInteger = local_4c.IsInteger;
    this_00->IsFloat = local_4c.IsFloat;
    *(undefined3 *)&this_00->field_0x5 = local_4c._5_3_;
    (this->Format).SSW = local_4c.SSW;
    (this->Format).SSH = local_4c.SSH;
    piVar3 = this->planes_r;
    if ((this->Format).IsFamilyYUV != false) {
      piVar3 = this->planes_y;
    }
    this->planes = piVar3;
    iVar1 = (this->_vi).height;
    this->FrameWidth = (this->_vi).width;
    this->FrameHeight = iVar1;
    iVar1 = (this->Format).Planes;
    uVar7 = (ulong)iVar1;
    uVar5 = uVar7 * 8;
    if ((long)uVar7 < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppuVar2 = (uchar **)operator_new__(uVar5);
    this->SrcPointers = ppuVar2;
    uVar5 = uVar7 << 2;
    if (iVar1 < 0) {
      uVar5 = 0xffffffffffffffff;
    }
    piVar3 = (int *)operator_new__(uVar5);
    this->StrideBytes = piVar3;
    for (lVar6 = 0; lVar6 < (int)uVar7; lVar6 = lVar6 + 1) {
      pBVar4 = VideoFrame::GetReadPtr(src->p,this->planes[lVar6]);
      this->SrcPointers[lVar6] = pBVar4;
      iVar1 = VideoFrame::GetPitch(src->p,this->planes[lVar6]);
      this->StrideBytes[lVar6] = iVar1;
      uVar7 = (ulong)(uint)(this->Format).Planes;
    }
  }
  return;
}

Assistant:

DSFrame(PVideoFrame &src, VideoInfo vi, IScriptEnvironment * env)
    : _avssrc(src), _vi(vi), _env(env)
  {
    if (_avssrc) {
      Format = DSFormat(_vi.pixel_type);
      planes = Format.IsFamilyYUV ? planes_y : planes_r;
      FrameWidth = _vi.width;
      FrameHeight = _vi.height;

      SrcPointers = new const unsigned char*[Format.Planes];
      StrideBytes = new int[Format.Planes];
      for (int i = 0; i < Format.Planes; i++) {
        SrcPointers[i] = src->GetReadPtr(planes[i]);
        StrideBytes[i] = src->GetPitch(planes[i]);
      }
    }
  }